

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exampleObjectHandling.cpp
# Opt level: O0

int main(int param_1,char **param_2)

{
  string_view attrName;
  string_view attrName_00;
  string_view attrName_01;
  string_view attrName_02;
  string_view attrName_03;
  string_view attrName_04;
  bool bVar1;
  uint8_t *start;
  Slice SVar2;
  Options *options;
  ostream *poVar3;
  int __fd;
  exception *ex;
  Slice *value;
  default_sentinel_t __end1_1;
  ArrayIterator __begin1_1;
  ArrayIterator *__range1_1;
  Builder values;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  Slice s;
  Builder b;
  undefined4 in_stack_fffffffffffffbb8;
  undefined2 in_stack_fffffffffffffbbc;
  ValueType in_stack_fffffffffffffbbe;
  undefined1 in_stack_fffffffffffffbbf;
  Builder *in_stack_fffffffffffffbc0;
  undefined4 in_stack_fffffffffffffbc8;
  undefined2 in_stack_fffffffffffffbcc;
  undefined1 in_stack_fffffffffffffbce;
  ValueType in_stack_fffffffffffffbcf;
  Slice in_stack_fffffffffffffbd0;
  size_t in_stack_fffffffffffffbd8;
  char *in_stack_fffffffffffffbe0;
  Slice in_stack_fffffffffffffbe8;
  Builder *in_stack_fffffffffffffbf0;
  function<bool_(arangodb::velocypack::Slice,_arangodb::velocypack::Slice)> local_390;
  uint8_t *local_370;
  string local_368 [32];
  uint8_t *local_348;
  uint8_t **local_340;
  ArrayIterator local_330;
  uint8_t *local_310;
  ArrayIterator local_308;
  ArrayIterator *local_2e8;
  uint8_t *local_2e0;
  reference local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_218;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_210;
  uint8_t *local_208;
  undefined1 local_200 [24];
  undefined1 *local_1e8;
  Slice local_1e0;
  uint8_t local_1d8 [96];
  int local_178;
  Builder local_c8;
  int local_4;
  
  local_4 = 0;
  arangodb::velocypack::Builder::Builder(in_stack_fffffffffffffbf0);
  arangodb::velocypack::Value::Value
            ((Value *)in_stack_fffffffffffffbd0._start,in_stack_fffffffffffffbcf,
             (bool)in_stack_fffffffffffffbce);
  arangodb::velocypack::Builder::operator()
            (in_stack_fffffffffffffbc0,
             (Value *)CONCAT17(in_stack_fffffffffffffbbf,
                               CONCAT16(in_stack_fffffffffffffbbe,
                                        CONCAT24(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8
                                                ))));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffbd0._start,
             (char *)CONCAT17(in_stack_fffffffffffffbcf,
                              CONCAT16(in_stack_fffffffffffffbce,
                                       CONCAT24(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8)
                                      )));
  arangodb::velocypack::Value::Value
            ((Value *)in_stack_fffffffffffffbc0,
             CONCAT13(in_stack_fffffffffffffbbf,
                      CONCAT12(in_stack_fffffffffffffbbe,in_stack_fffffffffffffbbc)),
             (ValueType)((uint)in_stack_fffffffffffffbb8 >> 0x18));
  attrName._M_str = in_stack_fffffffffffffbe0;
  attrName._M_len = in_stack_fffffffffffffbd8;
  arangodb::velocypack::Builder::add
            ((Builder *)in_stack_fffffffffffffbd0._start,attrName,
             (Value *)CONCAT17(in_stack_fffffffffffffbcf,
                               CONCAT16(in_stack_fffffffffffffbce,
                                        CONCAT24(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8
                                                ))));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffbd0._start,
             (char *)CONCAT17(in_stack_fffffffffffffbcf,
                              CONCAT16(in_stack_fffffffffffffbce,
                                       CONCAT24(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8)
                                      )));
  arangodb::velocypack::Value::Value
            ((Value *)in_stack_fffffffffffffbc0,
             (char *)CONCAT17(in_stack_fffffffffffffbbf,
                              CONCAT16(in_stack_fffffffffffffbbe,
                                       CONCAT24(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8)
                                      )),None);
  attrName_00._M_str = in_stack_fffffffffffffbe0;
  attrName_00._M_len = in_stack_fffffffffffffbd8;
  arangodb::velocypack::Builder::add
            ((Builder *)in_stack_fffffffffffffbd0._start,attrName_00,
             (Value *)CONCAT17(in_stack_fffffffffffffbcf,
                               CONCAT16(in_stack_fffffffffffffbce,
                                        CONCAT24(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8
                                                ))));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffbd0._start,
             (char *)CONCAT17(in_stack_fffffffffffffbcf,
                              CONCAT16(in_stack_fffffffffffffbce,
                                       CONCAT24(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8)
                                      )));
  arangodb::velocypack::Value::Value
            ((Value *)in_stack_fffffffffffffbd0._start,in_stack_fffffffffffffbcf,
             (bool)in_stack_fffffffffffffbce);
  attrName_01._M_str = in_stack_fffffffffffffbe0;
  attrName_01._M_len = in_stack_fffffffffffffbd8;
  arangodb::velocypack::Builder::add
            ((Builder *)in_stack_fffffffffffffbd0._start,attrName_01,
             (Value *)CONCAT17(in_stack_fffffffffffffbcf,
                               CONCAT16(in_stack_fffffffffffffbce,
                                        CONCAT24(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8
                                                ))));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffbd0._start,
             (char *)CONCAT17(in_stack_fffffffffffffbcf,
                              CONCAT16(in_stack_fffffffffffffbce,
                                       CONCAT24(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8)
                                      )));
  arangodb::velocypack::Value::Value
            ((Value *)in_stack_fffffffffffffbc0,(bool)in_stack_fffffffffffffbbf,
             in_stack_fffffffffffffbbe);
  attrName_02._M_str = in_stack_fffffffffffffbe0;
  attrName_02._M_len = in_stack_fffffffffffffbd8;
  arangodb::velocypack::Builder::add
            ((Builder *)in_stack_fffffffffffffbd0._start,attrName_02,
             (Value *)CONCAT17(in_stack_fffffffffffffbcf,
                               CONCAT16(in_stack_fffffffffffffbce,
                                        CONCAT24(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8
                                                ))));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffbd0._start,
             (char *)CONCAT17(in_stack_fffffffffffffbcf,
                              CONCAT16(in_stack_fffffffffffffbce,
                                       CONCAT24(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8)
                                      )));
  arangodb::velocypack::Value::Value
            ((Value *)in_stack_fffffffffffffbc0,
             (char *)CONCAT17(in_stack_fffffffffffffbbf,
                              CONCAT16(in_stack_fffffffffffffbbe,
                                       CONCAT24(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8)
                                      )),None);
  attrName_03._M_str = in_stack_fffffffffffffbe0;
  attrName_03._M_len = in_stack_fffffffffffffbd8;
  arangodb::velocypack::Builder::add
            ((Builder *)in_stack_fffffffffffffbd0._start,attrName_03,
             (Value *)CONCAT17(in_stack_fffffffffffffbcf,
                               CONCAT16(in_stack_fffffffffffffbce,
                                        CONCAT24(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8
                                                ))));
  arangodb::velocypack::Builder::close(&local_c8,local_178);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffbd0._start,
             (char *)CONCAT17(in_stack_fffffffffffffbcf,
                              CONCAT16(in_stack_fffffffffffffbce,
                                       CONCAT24(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8)
                                      )));
  arangodb::velocypack::Value::Value
            ((Value *)in_stack_fffffffffffffbd0._start,in_stack_fffffffffffffbcf,
             (bool)in_stack_fffffffffffffbce);
  attrName_04._M_str = in_stack_fffffffffffffbe0;
  attrName_04._M_len = in_stack_fffffffffffffbd8;
  arangodb::velocypack::Builder::add
            ((Builder *)in_stack_fffffffffffffbd0._start,attrName_04,
             (Value *)CONCAT17(in_stack_fffffffffffffbcf,
                               CONCAT16(in_stack_fffffffffffffbce,
                                        CONCAT24(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8
                                                ))));
  arangodb::velocypack::Value::Value
            ((Value *)in_stack_fffffffffffffbc0,
             CONCAT13(in_stack_fffffffffffffbbf,
                      CONCAT12(in_stack_fffffffffffffbbe,in_stack_fffffffffffffbbc)),
             (ValueType)((uint)in_stack_fffffffffffffbb8 >> 0x18));
  arangodb::velocypack::Builder::add
            (in_stack_fffffffffffffbc0,
             (Value *)CONCAT17(in_stack_fffffffffffffbbf,
                               CONCAT16(in_stack_fffffffffffffbbe,
                                        CONCAT24(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8
                                                ))));
  arangodb::velocypack::Value::Value
            ((Value *)in_stack_fffffffffffffbc0,
             CONCAT13(in_stack_fffffffffffffbbf,
                      CONCAT12(in_stack_fffffffffffffbbe,in_stack_fffffffffffffbbc)),
             (ValueType)((uint)in_stack_fffffffffffffbb8 >> 0x18));
  arangodb::velocypack::Builder::add
            (in_stack_fffffffffffffbc0,
             (Value *)CONCAT17(in_stack_fffffffffffffbbf,
                               CONCAT16(in_stack_fffffffffffffbbe,
                                        CONCAT24(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8
                                                ))));
  SVar2._start = local_1d8;
  arangodb::velocypack::Value::Value
            ((Value *)in_stack_fffffffffffffbc0,
             CONCAT13(in_stack_fffffffffffffbbf,
                      CONCAT12(in_stack_fffffffffffffbbe,in_stack_fffffffffffffbbc)),
             (ValueType)((uint)in_stack_fffffffffffffbb8 >> 0x18));
  __fd = (int)SVar2._start;
  arangodb::velocypack::Builder::add
            (in_stack_fffffffffffffbc0,
             (Value *)CONCAT17(in_stack_fffffffffffffbbf,
                               CONCAT16(in_stack_fffffffffffffbbe,
                                        CONCAT24(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8
                                                ))));
  arangodb::velocypack::Builder::close(&local_c8,__fd);
  arangodb::velocypack::Builder::close(&local_c8,__fd);
  start = arangodb::velocypack::Builder::start(in_stack_fffffffffffffbc0);
  arangodb::velocypack::Slice::Slice(&local_1e0,start);
  local_208 = local_1e0._start;
  arangodb::velocypack::Collection::keys_abi_cxx11_(in_stack_fffffffffffffbe8);
  local_1e8 = local_200;
  local_210._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT17(in_stack_fffffffffffffbbf,
                           CONCAT16(in_stack_fffffffffffffbbe,
                                    CONCAT24(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8))))
  ;
  local_218 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)CONCAT17(in_stack_fffffffffffffbbf,
                                CONCAT16(in_stack_fffffffffffffbbe,
                                         CONCAT24(in_stack_fffffffffffffbbc,
                                                  in_stack_fffffffffffffbb8))));
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffffbc0,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)CONCAT17(in_stack_fffffffffffffbbf,
                                   CONCAT16(in_stack_fffffffffffffbbe,
                                            CONCAT24(in_stack_fffffffffffffbbc,
                                                     in_stack_fffffffffffffbb8))));
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_220 = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&local_210);
    poVar3 = std::operator<<((ostream *)&std::cout,"Object has key \'");
    poVar3 = std::operator<<(poVar3,(string *)local_220);
    poVar3 = std::operator<<(poVar3,"\'");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_210);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffbd0._start);
  local_2e0 = local_1e0._start;
  arangodb::velocypack::Collection::values(SVar2);
  local_310 = (uint8_t *)
              arangodb::velocypack::Builder::slice
                        ((Builder *)
                         CONCAT17(in_stack_fffffffffffffbbf,
                                  CONCAT16(in_stack_fffffffffffffbbe,
                                           CONCAT24(in_stack_fffffffffffffbbc,
                                                    in_stack_fffffffffffffbb8))));
  arangodb::velocypack::ArrayIterator::ArrayIterator
            ((ArrayIterator *)
             CONCAT17(in_stack_fffffffffffffbcf,
                      CONCAT16(in_stack_fffffffffffffbce,
                               CONCAT24(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8))),
             in_stack_fffffffffffffbd0);
  local_2e8 = &local_308;
  arangodb::velocypack::ArrayIterator::begin(&local_330,local_2e8);
  arangodb::velocypack::ArrayIterator::end(local_2e8);
  while( true ) {
    bVar1 = arangodb::velocypack::ArrayIterator::operator==(&local_330);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    SVar2 = arangodb::velocypack::ArrayIterator::operator*
                      ((ArrayIterator *)
                       CONCAT17(in_stack_fffffffffffffbbf,
                                CONCAT16(in_stack_fffffffffffffbbe,
                                         CONCAT24(in_stack_fffffffffffffbbc,
                                                  in_stack_fffffffffffffbb8))));
    local_340 = &local_348;
    local_348 = SVar2._start;
    options = (Options *)std::operator<<((ostream *)&std::cout,"Object value is: ");
    poVar3 = arangodb::velocypack::operator<<
                       ((ostream *)in_stack_fffffffffffffbc0,
                        (Slice *)CONCAT17(in_stack_fffffffffffffbbf,
                                          CONCAT16(in_stack_fffffffffffffbbe,
                                                   CONCAT24(in_stack_fffffffffffffbbc,
                                                            in_stack_fffffffffffffbb8))));
    poVar3 = std::operator<<(poVar3,", as JSON: ");
    arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice>::
    toJson_abi_cxx11_((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                      SVar2._start,options);
    poVar3 = std::operator<<(poVar3,local_368);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffbc0);
    arangodb::velocypack::ArrayIterator::operator++((ArrayIterator *)in_stack_fffffffffffffbc0);
  }
  local_370 = local_1e0._start;
  SVar2._start = (uint8_t *)&local_390;
  std::function<bool(arangodb::velocypack::Slice,arangodb::velocypack::Slice)>::
  function<main::__0,void>
            ((function<bool_(arangodb::velocypack::Slice,_arangodb::velocypack::Slice)> *)
             SVar2._start,
             (anon_class_1_0_00000001 *)
             CONCAT17(in_stack_fffffffffffffbcf,
                      CONCAT16(in_stack_fffffffffffffbce,
                               CONCAT24(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8))));
  arangodb::velocypack::Collection::visitRecursive
            (SVar2,CONCAT13(in_stack_fffffffffffffbcf,
                            CONCAT12(in_stack_fffffffffffffbce,in_stack_fffffffffffffbcc)),
             (function<bool_(arangodb::velocypack::Slice,_arangodb::velocypack::Slice)> *)
             in_stack_fffffffffffffbc0);
  std::function<bool_(arangodb::velocypack::Slice,_arangodb::velocypack::Slice)>::~function
            ((function<bool_(arangodb::velocypack::Slice,_arangodb::velocypack::Slice)> *)0x103b5e);
  arangodb::velocypack::Builder::~Builder(in_stack_fffffffffffffbc0);
  arangodb::velocypack::Builder::~Builder(in_stack_fffffffffffffbc0);
  return local_4;
}

Assistant:

int main(int, char*[]) {
  VELOCYPACK_GLOBAL_EXCEPTION_TRY

  // create an object with a few members
  Builder b;

  b(Value(ValueType::Object));
  b.add("foo", Value(42));
  b.add("bar", Value("some string value"));
  b.add("baz", Value(ValueType::Object));
  b.add("qux", Value(true));
  b.add("bart", Value("this is a string"));
  b.close();
  b.add("quux", Value(ValueType::Array));
  b.add(Value(1));
  b.add(Value(2));
  b.add(Value(3));
  b.close();
  b.close();

  // a Slice is a lightweight accessor for a VPack value
  Slice s(b.start());

  // get all object keys. returns a vector of strings
  for (auto const& key : Collection::keys(s)) {
    // print key
    std::cout << "Object has key '" << key << "'" << std::endl;
  }

  // get all object values. returns a Builder object with an Array inside
  Builder values = Collection::values(s);
  for (auto const& value : ArrayIterator(values.slice())) {
    std::cout << "Object value is: " << value << ", as JSON: " << value.toJson()
              << std::endl;
  }

  // recursively visit all members in the Object
  // PostOrder here means we'll be visiting compound members before
  // we're diving into their subvalues
  Collection::visitRecursive(
      s, Collection::PostOrder,
      [](Slice const& key, Slice const& value) -> bool {
        if (!key.isNone()) {
          // we are visiting an Object member
          std::cout << "Visiting Object member: " << key.copyString()
                    << ", value: " << value.toJson() << std::endl;
        } else {
          // we are visiting an Array member
          std::cout << "Visiting Array member: " << value.toJson() << std::endl;
        }
        // to continue visiting, return true. to abort visiting, return false
        return true;
      });

  VELOCYPACK_GLOBAL_EXCEPTION_CATCH
}